

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar;
  undefined1 local_930 [24];
  undefined1 local_918 [16];
  char local_908 [16];
  undefined1 local_8f8 [32];
  string local_8d8;
  undefined1 local_8b8 [16];
  char local_8a8 [16];
  string local_898;
  string local_878;
  string local_858;
  Amount local_838;
  Pubkey local_828;
  string local_810;
  undefined1 local_7f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  uchar local_7d0 [16];
  pointer local_7c0;
  pointer local_7a8;
  pointer local_790;
  TapBranch local_778;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_700;
  Script local_6e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6a8;
  ByteData local_678;
  ConfidentialTransactionController txc;
  Privkey local_610;
  Address addr;
  ConfidentialTxOutReference local_478;
  ConfidentialTxOutReference local_380;
  ConfidentialTxOutReference local_288;
  ConfidentialTxInReference local_190;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&txc,2,0);
  cfd::core::Address::Address(&addr);
  gtest_ar._0_8_ = local_930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_7f0,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxIn(&local_190,&txc,(Txid *)local_7f0,0,0xfffffffd);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
  local_7f0._0_8_ = &PTR__Txid_00723450;
  if ((pointer)local_7f0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_7f0._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_930) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  local_918._0_8_ = local_908;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_918,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_7f0,(string *)local_918,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_8f8);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_8b8._0_8_ = AVar3.amount_;
  local_8b8[8] = AVar3.ignore_check_;
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8d8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar,&local_8d8);
  cfd::ConfidentialTransactionController::AddTxOut
            (&local_288,&txc,(Address *)local_7f0,(Amount *)local_8b8,
             (ConfidentialAssetId *)&gtest_ar);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_288);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_6a8);
  cfd::core::Script::~Script(&local_6e8);
  local_778._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_700);
  cfd::core::TapBranch::~TapBranch(&local_778);
  if (local_790 != (pointer)0x0) {
    operator_delete(local_790);
  }
  if (local_7a8 != (pointer)0x0) {
    operator_delete(local_7a8);
  }
  if (local_7c0 != (pointer)0x0) {
    operator_delete(local_7c0);
  }
  if ((uchar *)local_7e0._M_allocated_capacity != local_7d0) {
    operator_delete((void *)local_7e0._M_allocated_capacity);
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_8f8);
  if ((char *)local_918._0_8_ != local_908) {
    operator_delete((void *)local_918._0_8_);
  }
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_838.amount_ = AVar3.amount_;
  local_838.ignore_check_ = AVar3.ignore_check_;
  local_918._0_8_ = local_908;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_918,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_918);
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             "");
  cfd::core::BlockHash::BlockHash((BlockHash *)&local_8d8,(string *)local_8f8);
  local_8b8._0_8_ = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b8,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo","");
  cfd::core::Address::Address((Address *)local_7f0,(string *)local_8b8);
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_878,
             "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d","");
  cfd::core::Pubkey::Pubkey(&local_828,&local_878);
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_898,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL","");
  cfd::core::Privkey::FromWif(&local_610,&local_898,kRegtest,true);
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,"");
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_810,
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,"");
  cfd::core::ByteData::ByteData(&local_678,&local_810);
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            (&local_380,&txc,&local_838,(ConfidentialAssetId *)&gtest_ar,(BlockHash *)&local_8d8,
             (Address *)local_7f0,kRegtest,&local_828,&local_610,&local_858,0,&local_678,
             kElementsRegtest,&addr);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_380);
  if (local_678.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_678.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if (local_610.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_610.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p);
  }
  if (local_828.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_828.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_6a8);
  cfd::core::Script::~Script(&local_6e8);
  local_778._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_700);
  cfd::core::TapBranch::~TapBranch(&local_778);
  if (local_790 != (pointer)0x0) {
    operator_delete(local_790);
  }
  if (local_7a8 != (pointer)0x0) {
    operator_delete(local_7a8);
  }
  if (local_7c0 != (pointer)0x0) {
    operator_delete(local_7c0);
  }
  if ((uchar *)local_7e0._M_allocated_capacity != local_7d0) {
    operator_delete((void *)local_7e0._M_allocated_capacity);
  }
  if ((char *)local_8b8._0_8_ != local_8a8) {
    operator_delete((void *)local_8b8._0_8_);
  }
  local_8d8._M_dataplus._M_p = (pointer)&PTR__BlockHash_00723790;
  if ((void *)local_8d8._M_string_length != (void *)0x0) {
    operator_delete((void *)local_8d8._M_string_length);
  }
  if ((pointer)local_8f8._0_8_ != (pointer)(local_8f8 + 0x10)) {
    operator_delete((void *)local_8f8._0_8_);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((char *)local_918._0_8_ != local_908) {
    operator_delete((void *)local_918._0_8_);
  }
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_918._0_8_ = AVar3.amount_;
  local_918[8] = AVar3.ignore_check_;
  gtest_ar._0_8_ = local_930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_7f0,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxOutFee
            (&local_478,&txc,(Amount *)local_918,(ConfidentialAssetId *)local_7f0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_478);
  local_7f0._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if ((pointer)local_7f0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_7f0._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_930) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_7f0,&txc.super_AbstractTransactionController);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_7f0._0_8_,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._0_8_ != &local_7e0) {
    operator_delete((void *)local_7f0._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_7f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_918,(Message *)local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_7f0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_7f0,&addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",(char *)local_7f0._0_8_,
             "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._0_8_ != &local_7e0) {
    operator_delete((void *)local_7f0._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_7f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_918,(Message *)local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_7f0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&addr.format_data_);
  cfd::core::Script::~Script(&addr.redeem_script_);
  addr.script_tree_.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30
  ;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&addr.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&addr.script_tree_.super_TapBranch);
  if (addr.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(addr.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (addr.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(addr.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (addr.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(addr.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)addr.address_._M_dataplus._M_p != &addr.address_.field_2) {
    operator_delete(addr.address_._M_dataplus._M_p);
  }
  txc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&txc.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}